

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O0

void vm_free(VM *vm)

{
  int local_14;
  int i;
  VM *vm_local;
  
  for (local_14 = 0; local_14 < vm->fns_count; local_14 = local_14 + 1) {
    free(vm->fns[local_14].ins);
  }
  free(vm->pkgs);
  free(vm->fns);
  free(vm->consts);
  free(vm->stack);
  return;
}

Assistant:

void vm_free(VM *vm) {
	for (int i = 0; i < vm->fns_count; i++) {
		free(vm->fns[i].ins);
	}
	free(vm->pkgs);
	free(vm->fns);
	free(vm->consts);
	free(vm->stack);
}